

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O2

bool llvm::consumeUnsignedInteger(StringRef *Str,uint Radix,unsigned_long_long *Result)

{
  ulong uVar1;
  char cVar2;
  bool bVar3;
  ulong uVar4;
  int iVar5;
  StringRef local_48;
  
  if (Radix == 0) {
    Radix = GetAutoSenseRadix(Str);
  }
  if (Str->Length == 0) {
LAB_001296b1:
    bVar3 = true;
  }
  else {
    local_48.Data = Str->Data;
    local_48.Length = Str->Length;
    *Result = 0;
    for (; local_48.Length != 0; local_48.Length = local_48.Length - (local_48.Length != 0)) {
      cVar2 = StringRef::operator[](&local_48,0);
      if (cVar2 < '0') {
LAB_00129623:
        cVar2 = StringRef::operator[](&local_48,0);
        if ('`' < cVar2) {
          cVar2 = StringRef::operator[](&local_48,0);
          iVar5 = -0x57;
          if (cVar2 < '{') goto LAB_00129663;
        }
        cVar2 = StringRef::operator[](&local_48,0);
        if (cVar2 < 'A') break;
        cVar2 = StringRef::operator[](&local_48,0);
        iVar5 = -0x37;
        if ('Z' < cVar2) break;
      }
      else {
        cVar2 = StringRef::operator[](&local_48,0);
        iVar5 = -0x30;
        if ('9' < cVar2) goto LAB_00129623;
      }
LAB_00129663:
      cVar2 = StringRef::operator[](&local_48,0);
      if (Radix <= (uint)(cVar2 + iVar5)) break;
      uVar1 = *Result;
      uVar4 = (ulong)(uint)(cVar2 + iVar5) + uVar1 * Radix;
      *Result = uVar4;
      if (uVar4 / Radix < uVar1) goto LAB_001296b1;
      local_48.Data = local_48.Data + (local_48.Length != 0);
    }
    bVar3 = true;
    if (Str->Length != local_48.Length) {
      Str->Data = local_48.Data;
      Str->Length = local_48.Length;
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool llvm::consumeUnsignedInteger(StringRef &Str, unsigned Radix,
                                  unsigned long long &Result) {
  // Autosense radix if not specified.
  if (Radix == 0)
    Radix = GetAutoSenseRadix(Str);

  // Empty strings (after the radix autosense) are invalid.
  if (Str.empty()) return true;

  // Parse all the bytes of the string given this radix.  Watch for overflow.
  StringRef Str2 = Str;
  Result = 0;
  while (!Str2.empty()) {
    unsigned CharVal;
    if (Str2[0] >= '0' && Str2[0] <= '9')
      CharVal = Str2[0] - '0';
    else if (Str2[0] >= 'a' && Str2[0] <= 'z')
      CharVal = Str2[0] - 'a' + 10;
    else if (Str2[0] >= 'A' && Str2[0] <= 'Z')
      CharVal = Str2[0] - 'A' + 10;
    else
      break;

    // If the parsed value is larger than the integer radix, we cannot
    // consume any more characters.
    if (CharVal >= Radix)
      break;

    // Add in this character.
    unsigned long long PrevResult = Result;
    Result = Result * Radix + CharVal;

    // Check for overflow by shifting back and seeing if bits were lost.
    if (Result / Radix < PrevResult)
      return true;

    Str2 = Str2.substr(1);
  }

  // We consider the operation a failure if no characters were consumed
  // successfully.
  if (Str.size() == Str2.size())
    return true;

  Str = Str2;
  return false;
}